

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

void __thiscall
leveldb::DBImpl::RecoverLogFile(unsigned_long,bool,bool*,leveldb::VersionEdit*,unsigned_long*)::
LogReporter::Corruption(unsigned_long,leveldb::Status_const__(void *this,size_t bytes,Status *s)

{
  Logger *info_log;
  undefined8 uVar1;
  long *plVar2;
  char *pcVar3;
  string local_50;
  
  pcVar3 = "";
  if (*(long *)((long)this + 0x20) == 0) {
    pcVar3 = "(ignoring error) ";
  }
  info_log = *(Logger **)((long)this + 0x10);
  uVar1 = *(undefined8 *)((long)this + 0x18);
  Status::ToString_abi_cxx11_(&local_50,s);
  Log(info_log,"%s%s: dropping %d bytes; %s",pcVar3,uVar1,bytes & 0xffffffff,
      local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  plVar2 = *(long **)((long)this + 0x20);
  if (((plVar2 != (long *)0x0) && (*plVar2 == 0)) && (s->state_ != (char *)0x0)) {
    pcVar3 = Status::CopyState(s->state_);
    *plVar2 = (long)pcVar3;
  }
  return;
}

Assistant:

void Corruption(size_t bytes, const Status& s) override {
      Log(info_log, "%s%s: dropping %d bytes; %s",
          (this->status == nullptr ? "(ignoring error) " : ""), fname,
          static_cast<int>(bytes), s.ToString().c_str());
      if (this->status != nullptr && this->status->ok()) *this->status = s;
    }